

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int player_id_to_position(int _player_id)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  int local_c;
  int _player_id_local;
  
  iVar3 = _player_id - my_player_id;
  uVar2 = iVar3 + 4U;
  if ((int)(iVar3 + 4U) < 0) {
    uVar2 = iVar3 + 7;
  }
  switch((iVar3 + 4) - (uVar2 & 0xfffffffc)) {
  case 0:
    local_c = 0;
    break;
  case 1:
    local_c = 3;
    break;
  case 2:
    local_c = 2;
    break;
  case 3:
    local_c = 1;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_c;
}

Assistant:

int player_id_to_position(int _player_id) {
    switch ((_player_id + 4 - my_player_id) % 4) {
        case 0: //自己
            return 0;
        case 1: //下家
            return 3;
        case 2: //对家
            return 2;
        case 3: //上家
            return 1;
    }
}